

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

uint32 __thiscall Bstrlib::String::getUnicodeChar(String *this,int pos)

{
  uint32 uVar1;
  bool bVar2;
  uchar *local_20;
  uchar *array;
  String *pSStack_10;
  int pos_local;
  String *this_local;
  
  local_20 = (this->super_tagbstring).data;
  array._4_4_ = pos;
  pSStack_10 = this;
  while( true ) {
    bVar2 = false;
    if (array._4_4_ != 0) {
      bVar2 = *local_20 != '\0';
    }
    if (!bVar2) break;
    getUnicode(&local_20);
    array._4_4_ = array._4_4_ + -1;
  }
  uVar1 = getUnicode(&local_20);
  return uVar1;
}

Assistant:

uint32 String::getUnicodeChar(int pos) const
    {
        // 1. Iterate to the given position
        const unsigned char * array = data;
        while (pos && *array)
        {
            (void)getUnicode(array);
            pos--;
        }
        return getUnicode(array);
    }